

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::calcDiversity(Population *this)

{
  pointer pCVar1;
  pointer pCVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t pos;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)*(pointer *)
                 ((long)&(pCVar1->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                         _M_impl + 8) -
          *(long *)&(pCVar1->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                    _M_impl.super__Vector_impl_data >> 2;
  uVar4 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x60;
  iVar3 = (int)uVar4;
  uVar7 = 0;
  lVar6 = 0;
  while (uVar7 != (long)iVar3) {
    pCVar2 = pCVar1 + uVar7;
    uVar7 = uVar7 + 1;
    for (uVar8 = uVar7; uVar8 < (ulong)(long)iVar3; uVar8 = uVar8 + 1) {
      for (lVar9 = 0; lVar5 != lVar9; lVar9 = lVar9 + 1) {
        lVar6 = lVar6 + (ulong)(*(int *)(*(long *)&(pCVar2->turnList).
                                                                                                      
                                                  super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 4) !=
                               *(int *)(*(long *)&pCVar1[uVar8].turnList.
                                                  super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 4));
      }
    }
  }
  lVar5 = lVar5 * (int)((int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / -2
                             ) + ((uint)(iVar3 * iVar3) >> 1));
  auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar11._0_8_ = lVar6;
  auVar11._12_4_ = 0x45300000;
  auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  fVar10 = roundf((float)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                         ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) * 100.0);
  this->diversity = fVar10;
  return;
}

Assistant:

void Population::calcDiversity() {


    size_t orientationCount = chromosomes.front().turnList.size();

    int populationSize = (int) chromosomes.size();

    uint64_t sum = 0;

    for (size_t i = 0; i < populationSize; ++i)
    {
        for (size_t j = i + 1; j < populationSize; ++j)
        {
            const Chromosome & c1 = chromosomes[i];
            const Chromosome & c2 = chromosomes[j];

            for (size_t pos = 0; pos < orientationCount; ++pos)
            {
                if (c1.turnList[pos] != c2.turnList[pos])
                {
                    ++sum;
                }
            }
        }
    };

    uint64_t numComparisons = (uint64_t) ((populationSize * populationSize / 2) - (populationSize / 2));

    uint64_t total = numComparisons * orientationCount;

    diversity = static_cast<float>(static_cast<double>(sum) / total);
    diversity *= 100.0f;

    diversity = std::roundf(diversity);

}